

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O2

void __thiscall GrcFont::~GrcFont(GrcFont *this)

{
  CloseFile(this);
  if (this->m_pchFileName != (char *)0x0) {
    operator_delete__(this->m_pchFileName);
    this->m_pchFileName = (char *)0x0;
  }
  if (this->m_pCmap != (byte *)0x0) {
    operator_delete__(this->m_pCmap);
  }
  if (this->m_pGlyf != (byte *)0x0) {
    operator_delete__(this->m_pGlyf);
  }
  if (this->m_pHead != (byte *)0x0) {
    operator_delete__(this->m_pHead);
  }
  if (this->m_pHhea != (byte *)0x0) {
    operator_delete__(this->m_pHhea);
  }
  if (this->m_pHmtx != (byte *)0x0) {
    operator_delete__(this->m_pHmtx);
  }
  if (this->m_pLoca != (byte *)0x0) {
    operator_delete__(this->m_pLoca);
  }
  if (this->m_pMaxp != (byte *)0x0) {
    operator_delete__(this->m_pMaxp);
  }
  if (this->m_pOs2 != (byte *)0x0) {
    operator_delete__(this->m_pOs2);
  }
  if (this->m_pPost != (byte *)0x0) {
    operator_delete__(this->m_pPost);
  }
  if (this->m_pName != (byte *)0x0) {
    operator_delete__(this->m_pName);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_vnCollisions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_vnLimUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_vnMinUnicode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  return;
}

Assistant:

GrcFont::~GrcFont()
{
	CloseFile();
	if (m_pchFileName)
	{
		delete [] m_pchFileName;
		m_pchFileName = NULL;
	}
	if (m_pCmap)
		delete [] m_pCmap;
	if (m_pGlyf)
		delete [] m_pGlyf;
	if (m_pHead)
		delete [] m_pHead;
	if (m_pHhea)
		delete [] m_pHhea;
	if (m_pHmtx)
		delete [] m_pHmtx;
	if (m_pLoca)
		delete [] m_pLoca;
	if (m_pMaxp)
		delete [] m_pMaxp;
	if (m_pOs2)
		delete [] m_pOs2;
	if (m_pPost)
		delete [] m_pPost;
	if (m_pName)
		delete [] m_pName;
}